

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O3

JavascriptError * __thiscall
Js::JavascriptError::CreateNewErrorOfSameType
          (JavascriptError *this,JavascriptLibrary *targetJavascriptLibrary)

{
  code *pcVar1;
  bool bVar2;
  JavascriptError *pJVar3;
  undefined4 *puVar4;
  
  switch(this->m_errorType) {
  case kjstError:
    pJVar3 = JavascriptLibrary::CreateError(targetJavascriptLibrary);
    return pJVar3;
  case kjstEvalError:
    pJVar3 = JavascriptLibrary::CreateEvalError(targetJavascriptLibrary);
    return pJVar3;
  case kjstRangeError:
    pJVar3 = JavascriptLibrary::CreateRangeError(targetJavascriptLibrary);
    return pJVar3;
  case kjstReferenceError:
    pJVar3 = JavascriptLibrary::CreateReferenceError(targetJavascriptLibrary);
    return pJVar3;
  case kjstSyntaxError:
    pJVar3 = JavascriptLibrary::CreateSyntaxError(targetJavascriptLibrary);
    return pJVar3;
  case kjstTypeError:
    pJVar3 = JavascriptLibrary::CreateTypeError(targetJavascriptLibrary);
    return pJVar3;
  case kjstURIError:
    pJVar3 = JavascriptLibrary::CreateURIError(targetJavascriptLibrary);
    return pJVar3;
  case kjstAggregateError:
    pJVar3 = JavascriptLibrary::CreateAggregateError(targetJavascriptLibrary);
    return pJVar3;
  case kjstWebAssemblyCompileError:
    JavascriptLibrary::CreateWebAssemblyCompileError(targetJavascriptLibrary);
  case kjstWebAssemblyRuntimeError:
    JavascriptLibrary::CreateWebAssemblyRuntimeError(targetJavascriptLibrary);
  case kjstWebAssemblyLinkError:
    pJVar3 = JavascriptLibrary::CreateWebAssemblyLinkError(targetJavascriptLibrary);
    break;
  default:
    pJVar3 = (JavascriptError *)0x0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                              ,0x377,"(false)","Unhandled error type?");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
  return pJVar3;
}

Assistant:

JavascriptError* JavascriptError::CreateNewErrorOfSameType(JavascriptLibrary* targetJavascriptLibrary)
    {
        JavascriptError* jsNewError = nullptr;
        switch (this->GetErrorType())
        {
        case kjstError:
            jsNewError = targetJavascriptLibrary->CreateError();
            break;
        case kjstEvalError:
            jsNewError = targetJavascriptLibrary->CreateEvalError();
            break;
        case kjstRangeError:
            jsNewError = targetJavascriptLibrary->CreateRangeError();
            break;
        case kjstReferenceError:
            jsNewError = targetJavascriptLibrary->CreateReferenceError();
            break;
        case kjstSyntaxError:
            jsNewError = targetJavascriptLibrary->CreateSyntaxError();
            break;
        case kjstTypeError:
            jsNewError = targetJavascriptLibrary->CreateTypeError();
            break;
        case kjstURIError:
            jsNewError = targetJavascriptLibrary->CreateURIError();
            break;
        case kjstAggregateError:
            jsNewError = targetJavascriptLibrary->CreateAggregateError();
            break;
        case kjstWebAssemblyCompileError:
            jsNewError = targetJavascriptLibrary->CreateWebAssemblyCompileError();
        case kjstWebAssemblyRuntimeError:
            jsNewError = targetJavascriptLibrary->CreateWebAssemblyRuntimeError();
        case kjstWebAssemblyLinkError:
            jsNewError = targetJavascriptLibrary->CreateWebAssemblyLinkError();

        case kjstCustomError:
        default:
            AssertMsg(false, "Unhandled error type?");
            break;
        }
        return jsNewError;
    }